

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O0

EVstone INT_REVcreate_bridge_action(CMConnection conn,attr_list contact_list,EVstone remote_stone)

{
  int iVar1;
  CMFormat p_Var2;
  CManager cm;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  EVcreate_bridge_action_request request;
  EV_int_response response;
  CMFormat f;
  int cond;
  CMFormat in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc4;
  CMConnection in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  EVstone local_24;
  int condition;
  int iVar3;
  undefined4 uVar4;
  
  memset(&stack0xffffffffffffffc0,0,0x18);
  iVar1 = INT_CMCondition_get((CManager)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              in_stack_ffffffffffffffc8);
  p_Var2 = INT_CMlookup_format((CManager)*in_RDI,EVcreate_bridge_action_req_formats);
  cm = (CManager)attr_list_to_string(in_RSI);
  iVar3 = iVar1;
  uVar4 = in_EDX;
  if (p_Var2 == (CMFormat)0x0) {
    p_Var2 = INT_CMregister_format(cm,(FMStructDescList)CONCAT44(in_stack_ffffffffffffffc4,iVar1));
  }
  condition = (int)((ulong)p_Var2 >> 0x20);
  INT_CMCondition_set_client_data
            ((CManager)CONCAT44(in_stack_ffffffffffffffd4,in_EDX),(int)((ulong)cm >> 0x20),
             (void *)CONCAT44(in_stack_ffffffffffffffc4,iVar1));
  INT_CMwrite((CMConnection)CONCAT44(in_stack_ffffffffffffffc4,iVar1),in_stack_ffffffffffffffb8,
              (void *)0x1554fc);
  free(cm);
  INT_CMCondition_wait((CManager)CONCAT44(uVar4,iVar3),condition);
  return local_24;
}

Assistant:

extern EVstone
INT_REVcreate_bridge_action(CMConnection conn, attr_list contact_list, EVstone remote_stone)
{
    int cond;
    CMFormat f;
    EV_int_response response;
    EVcreate_bridge_action_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVcreate_bridge_action_req_formats);
    request.contact_list = attr_list_to_string(contact_list);
    request.remote_stone = remote_stone;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVcreate_bridge_action_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, &response);
    INT_CMwrite(conn, f, &request);
    free(request.contact_list);
    INT_CMCondition_wait(conn->cm, cond);
    return (EVstone) response.ret;
}